

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

bool __thiscall TileWire::alternativeTile(TileWire *this)

{
  Board *pBVar1;
  Tile *in_RDI;
  
  if (*(int *)&in_RDI[8].field_0x24 == 3) {
    *(undefined4 *)&in_RDI[8].field_0x24 = 4;
    *(undefined4 *)((long)&in_RDI[9]._vptr_Tile + 4) = *(undefined4 *)&in_RDI[9]._vptr_Tile;
    (*in_RDI->_vptr_Tile[8])(in_RDI,0);
    pBVar1 = Tile::getBoardPtr(in_RDI);
    pBVar1->changesMade = true;
  }
  else if (*(int *)&in_RDI[8].field_0x24 == 4) {
    *(undefined4 *)&in_RDI[8].field_0x24 = 3;
    *(undefined4 *)((long)&in_RDI[9]._vptr_Tile + 4) = 1;
    (*in_RDI->_vptr_Tile[8])(in_RDI,0);
    pBVar1 = Tile::getBoardPtr(in_RDI);
    pBVar1->changesMade = true;
  }
  return false;
}

Assistant:

bool TileWire::alternativeTile() {
    if (_type == JUNCTION) {
        _type = CROSSOVER;
        _state2 = _state1;
        addUpdate();
        getBoardPtr()->changesMade = true;
    } else if (_type == CROSSOVER) {
        _type = JUNCTION;
        _state2 = LOW;
        addUpdate();
        getBoardPtr()->changesMade = true;
    }
    return false;
}